

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseGlobalModuleField(WastParser *this,Module *module)

{
  bool bVar1;
  Result RVar2;
  pointer *__ptr;
  Enum EVar3;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  Location local_a8;
  string name;
  ModuleFieldList export_fields;
  Location loc;
  
  RVar2 = Expect(this,Lpar);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation(&loc,this);
  RVar2 = Expect(this,Global);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&name);
  export_fields.first_ = (ModuleField *)0x0;
  export_fields.last_ = (ModuleField *)0x0;
  export_fields.size_ = 0;
  RVar2 = ParseInlineExports(this,&export_fields,Global);
  EVar3 = Error;
  if (RVar2.enum_ == Error) goto LAB_0017f33d;
  bVar1 = PeekMatchLpar(this,Import);
  if (bVar1) {
    CheckImportOrdering(this,module);
    std::make_unique<wabt::GlobalImport,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
    RVar2 = ParseInlineImport(this,(Import *)local_c8._0_8_);
    if ((RVar2.enum_ != Error) &&
       (RVar2 = ParseGlobalType(this,(Global *)(local_c8._0_8_ + 0x50)), RVar2.enum_ != Error)) {
      GetLocation(&local_a8,this);
      std::
      make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::GlobalImport,std::default_delete<wabt::GlobalImport>>,wabt::Location>
                ((unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> *)
                 (local_b8 + 8),(Location *)local_c8);
      local_b8._0_8_ = local_b8._8_8_;
      local_b8._8_8_ = (long *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                  *)local_b8);
      if (local_b8._0_8_ != 0) {
        (**(code **)(*(long *)local_b8._0_8_ + 8))();
      }
      local_b8._0_8_ = 0;
      if ((long *)local_b8._8_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_b8._8_8_ + 8))();
      }
LAB_0017f2fd:
      if ((Import *)local_c8._0_8_ != (Import *)0x0) {
        (*((Import *)local_c8._0_8_)->_vptr_Import[1])();
      }
      anon_unknown_1::AppendInlineExportFields
                (module,&export_fields,
                 (int)((ulong)((long)(module->globals).
                                     super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(module->globals).
                                    super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
      RVar2 = Expect(this,Rpar);
      EVar3 = (Enum)(RVar2.enum_ == Error);
      goto LAB_0017f33d;
    }
  }
  else {
    std::make_unique<wabt::GlobalModuleField,wabt::Location&,std::__cxx11::string&>
              (&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc);
    RVar2 = ParseGlobalType(this,(Global *)
                                 ((long)&((string *)(local_a8.filename._M_len + 0x28))->field_2 + 8)
                           );
    local_c8._0_8_ = local_a8.filename._M_len;
    if ((RVar2.enum_ != Error) &&
       (RVar2 = ParseTerminatingInstrList
                          (this,(ExprList *)
                                ((long)&(((Import *)(local_a8.filename._M_len + 0x50))->module_name)
                                        .field_2 + 8)), local_c8._0_8_ = local_a8.filename._M_len,
       RVar2.enum_ != Error)) {
      local_c8._8_8_ = local_a8.filename._M_len;
      local_a8.filename._M_len = 0;
      Module::AppendField(module,(unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                                  *)(local_c8 + 8));
      if ((Import *)local_c8._8_8_ != (Import *)0x0) {
        (*(*(_func_int ***)local_c8._8_8_)[1])();
      }
      local_c8._8_8_ = (char *)0x0;
      local_c8._0_8_ = local_a8.filename._M_len;
      goto LAB_0017f2fd;
    }
  }
  if ((Import *)local_c8._0_8_ != (Import *)0x0) {
    (*((Import *)local_c8._0_8_)->_vptr_Import[1])();
  }
LAB_0017f33d:
  intrusive_list<wabt::ModuleField>::clear(&export_fields);
  std::__cxx11::string::_M_dispose();
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseGlobalModuleField(Module* module) {
  WABT_TRACE(ParseGlobalModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Global);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Global));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<GlobalImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseGlobalType(&import->global));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = std::make_unique<GlobalModuleField>(loc, name);
    CHECK_RESULT(ParseGlobalType(&field->global));
    CHECK_RESULT(ParseTerminatingInstrList(&field->global.init_expr));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->globals.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}